

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void ParseArguments(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  runtime_error *this;
  char **ppcVar3;
  int iVar4;
  allocator local_49;
  string local_48;
  
  pcVar2 = s_filename;
LAB_0010a734:
  while( true ) {
    s_filename = pcVar2;
    iVar4 = argc;
    ppcVar3 = argv;
    argc = iVar4 + -1;
    if (argc == 0) {
      if (s_filename != (char *)0x0) {
        return;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"No rom file given.");
      goto LAB_0010a83c;
    }
    argv = ppcVar3 + 1;
    pcVar2 = *argv;
    if (*pcVar2 == '-') break;
    if (s_filename != (char *)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"multiple filenames");
LAB_0010a83c:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  cVar1 = pcVar2[1];
  if (cVar1 == 'b') {
    if (iVar4 == 2) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"filename required for -b");
      goto LAB_0010a83c;
    }
    s_boot_rom_filename = ppcVar3[2];
  }
  else {
    pcVar2 = s_filename;
    if (cVar1 == 't') {
      s_trace = 1;
      goto LAB_0010a734;
    }
    if (cVar1 == 'o') {
      if (iVar4 == 2) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"filename required for -o");
        goto LAB_0010a83c;
      }
      s_ppm_filename = ppcVar3[2];
    }
    else {
      if (cVar1 != 'f') goto LAB_0010a734;
      if (iVar4 == 2) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"frame count required for -f");
        goto LAB_0010a83c;
      }
      std::__cxx11::string::string((string *)&local_48,ppcVar3[2],&local_49);
      s_frames = std::__cxx11::stoi(&local_48,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  argv = ppcVar3 + 2;
  argc = iVar4 + -2;
  pcVar2 = s_filename;
  goto LAB_0010a734;
}

Assistant:

void ParseArguments(int argc, char** argv) {
  --argc;
  ++argv;
  for (; argc; --argc, ++argv) {
    const char* arg = *argv;
    if (arg[0] == '-') {
      switch (arg[1]) {
        case 'f':
          if (--argc == 0) {
            throw Error("frame count required for -f");
          }
          try {
            s_frames = std::stoi(*++argv);
          } catch (const std::invalid_argument&) {
            throw Error("invalid frame count");
          }
          break;

        case 't':
          s_trace = true;
          break;

        case 'o':
          if (--argc == 0) {
            throw Error("filename required for -o");
          }
          s_ppm_filename = *++argv;
          break;

        case 'b':
          if (--argc == 0) {
            throw Error("filename required for -b");
          }
          s_boot_rom_filename = *++argv;
          break;
      }
    } else if (s_filename) {
      throw Error("multiple filenames");
    } else {
      s_filename = arg;
    }
  }

  if (!s_filename) {
    throw Error("No rom file given.");
  }
}